

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_UINT32 final)

{
  uint uVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  uint uVar4;
  opj_tcd_tile_t *poVar5;
  opj_cp_t *poVar6;
  opj_tcd_tilecomp_t *poVar7;
  OPJ_INT32 *pOVar8;
  opj_tcd_resolution_t *poVar9;
  opj_tcd_precinct_t *poVar10;
  opj_tcd_cblk_enc_t *poVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  int *piVar24;
  int *piVar25;
  ulong uVar26;
  OPJ_INT32 matrice [10] [10] [3];
  int local_4e8 [302];
  
  poVar5 = tcd->tcd_image->tiles;
  uVar17 = (ulong)poVar5->numcomps;
  if (uVar17 != 0) {
    poVar6 = tcd->cp;
    poVar7 = poVar5->comps;
    uVar13 = (ulong)tcd->tcp->numlayers;
    uVar14 = 0;
    do {
      if (uVar13 != 0) {
        uVar1 = poVar7[uVar14].numresolutions;
        iVar16 = 0;
        piVar24 = local_4e8;
        uVar21 = 0;
        do {
          if ((ulong)uVar1 != 0) {
            uVar2 = tcd->image->comps[uVar14].prec;
            pOVar8 = (poVar6->m_specific_param).m_enc.m_matrice;
            uVar26 = 0;
            piVar25 = piVar24;
            iVar20 = iVar16;
            do {
              lVar22 = 0;
              do {
                piVar25[lVar22] =
                     (int)((float)pOVar8[(uint)(iVar20 + (int)lVar22)] *
                          (float)((double)uVar2 * 0.0625));
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              uVar26 = uVar26 + 1;
              piVar25 = piVar25 + 3;
              iVar20 = iVar20 + 3;
            } while (uVar26 != uVar1);
          }
          uVar21 = uVar21 + 1;
          piVar24 = piVar24 + 0x1e;
          iVar16 = iVar16 + uVar1 * 3;
        } while (uVar21 != uVar13);
      }
      uVar1 = poVar7[uVar14].numresolutions;
      if ((ulong)uVar1 != 0) {
        poVar9 = poVar7[uVar14].resolutions;
        uVar21 = 0;
        do {
          uVar2 = poVar9[uVar21].numbands;
          if ((ulong)uVar2 != 0) {
            uVar26 = 0;
            do {
              if (((poVar9[uVar21].bands[uVar26].x1 != poVar9[uVar21].bands[uVar26].x0) &&
                  (poVar9[uVar21].bands[uVar26].y1 != poVar9[uVar21].bands[uVar26].y0)) &&
                 (uVar15 = poVar9[uVar21].ph * poVar9[uVar21].pw, uVar15 != 0)) {
                poVar10 = poVar9[uVar21].bands[uVar26].precincts;
                uVar19 = 0;
                do {
                  uVar12 = poVar10[uVar19].ch * poVar10[uVar19].cw;
                  if (uVar12 != 0) {
                    OVar3 = tcd->image->comps[uVar14].prec;
                    lVar22 = 0;
                    do {
                      poVar11 = poVar10[uVar19].cblks.enc;
                      iVar16 = OVar3 - *(int *)((long)&poVar11->numbps + lVar22);
                      if (layno == 0) {
                        iVar20 = local_4e8[(ulong)layno * 0x1e + uVar21 * 3 + uVar26];
                        iVar23 = iVar20 - iVar16;
                        if (iVar23 == 0 || iVar20 < iVar16) {
                          iVar23 = 0;
                        }
                      }
                      else {
                        iVar20 = local_4e8[(ulong)(layno - 1) * 0x1e + uVar21 * 3 + uVar26];
                        iVar23 = local_4e8[(ulong)layno * 0x1e + uVar21 * 3 + uVar26] - iVar20;
                        if (iVar20 - iVar16 == 0 || iVar20 < iVar16) {
                          iVar23 = (iVar20 - iVar16) + iVar23;
                          if (iVar23 < 1) {
                            iVar23 = 0;
                          }
                        }
                      }
                      if (layno == 0) {
                        *(undefined4 *)((long)&poVar11->numpassesinlayers + lVar22) = 0;
                      }
                      iVar16 = *(int *)((long)&poVar11->numpassesinlayers + lVar22);
                      if (iVar16 == 0) {
                        if (iVar23 == 0) {
                          iVar20 = 0;
                        }
                        else {
                          iVar20 = iVar23 * 3 + -2;
                        }
                      }
                      else {
                        iVar20 = iVar23 * 3 + iVar16;
                      }
                      piVar24 = (int *)((ulong)layno * 0x18 +
                                       *(long *)((long)&poVar11->layers + lVar22));
                      *piVar24 = iVar20 - iVar16;
                      if (iVar20 - iVar16 != 0) {
                        lVar18 = *(long *)((long)&poVar11->passes + lVar22);
                        iVar23 = *(int *)(lVar18 + (ulong)(iVar20 - 1) * 0x18);
                        if (iVar16 == 0) {
                          piVar24[1] = iVar23;
                          lVar18 = *(long *)((long)&poVar11->data + lVar22);
                        }
                        else {
                          uVar4 = *(uint *)(lVar18 + (ulong)(iVar16 - 1) * 0x18);
                          piVar24[1] = iVar23 - uVar4;
                          lVar18 = (ulong)uVar4 + *(long *)((long)&poVar11->data + lVar22);
                        }
                        *(long *)(piVar24 + 4) = lVar18;
                        if (final != 0) {
                          *(int *)((long)&poVar11->numpassesinlayers + lVar22) = iVar20;
                        }
                      }
                      lVar22 = lVar22 + 0x40;
                    } while ((ulong)uVar12 << 6 != lVar22);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar15);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar2);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar17);
  }
  return;
}

Assistant:

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd, OPJ_UINT32 layno,
                             OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_INT32 value;                        /*, matrice[tcd_tcp->numlayers][tcd_tile->comps[0].numresolutions][3]; */
    OPJ_INT32 matrice[10][10][3];
    OPJ_UINT32 i, j, k;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (i = 0; i < tcd_tcp->numlayers; i++) {
            for (j = 0; j < tilec->numresolutions; j++) {
                for (k = 0; k < 3; k++) {
                    matrice[i][j][k] =
                        (OPJ_INT32)((OPJ_FLOAT32)cp->m_specific_param.m_enc.m_matrice[i *
                                      tilec->numresolutions * 3 + j * 3 + k]
                                    * (OPJ_FLOAT32)(tcd->image->comps[compno].prec / 16.0));
                }
            }
        }

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;
                        OPJ_INT32 imsb = (OPJ_INT32)(tcd->image->comps[compno].prec -
                                                     cblk->numbps); /* number of bit-plan equal to zero */

                        /* Correction of the matrix of coefficient to include the IMSB information */
                        if (layno == 0) {
                            value = matrice[layno][resno][bandno];
                            if (imsb >= value) {
                                value = 0;
                            } else {
                                value -= imsb;
                            }
                        } else {
                            value = matrice[layno][resno][bandno] - matrice[layno - 1][resno][bandno];
                            if (imsb >= matrice[layno - 1][resno][bandno]) {
                                value -= (imsb - matrice[layno - 1][resno][bandno]);
                                if (value < 0) {
                                    value = 0;
                                }
                            }
                        }

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;
                        if (cblk->numpassesinlayers == 0) {
                            if (value != 0) {
                                n = 3 * (OPJ_UINT32)value - 2 + cblk->numpassesinlayers;
                            } else {
                                n = cblk->numpassesinlayers;
                            }
                        } else {
                            n = 3 * (OPJ_UINT32)value + cblk->numpassesinlayers;
                        }

                        layer->numpasses = n - cblk->numpassesinlayers;

                        if (!layer->numpasses) {
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                        }

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
}